

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::
str<char_const(&)[25],kj::StringPtr&,char_const(&)[32],unsigned_int&,char_const(&)[26],kj::StringPtr&,kj::String&,char_const(&)[4]>
          (String *__return_storage_ptr__,kj *this,char (*params) [25],StringPtr *params_1,
          char (*params_2) [32],uint *params_3,char (*params_4) [26],StringPtr *params_5,
          String *params_6,char (*params_7) [4])

{
  char (*value) [25];
  StringPtr *pSVar1;
  char (*value_00) [32];
  kj *this_00;
  char (*value_01) [26];
  String *value_02;
  char (*value_03) [4];
  uint *value_04;
  String *params_7_00;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_14UL> local_80;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char (*local_38) [26];
  char (*params_local_4) [26];
  uint *params_local_3;
  char (*params_local_2) [32];
  StringPtr *params_local_1;
  char (*params_local) [25];
  
  params_7_00 = __return_storage_ptr__;
  local_38 = (char (*) [26])params_3;
  params_local_4 = (char (*) [26])params_2;
  params_local_3 = (uint *)params_1;
  params_local_2 = (char (*) [32])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [25])__return_storage_ptr__;
  value = ::const((char (*) [25])this);
  local_48 = toCharSequence<char_const(&)[25]>(value);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_58 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_00 = ::const((char (*) [32])params_local_3);
  local_68 = toCharSequence<char_const(&)[32]>(value_00);
  this_00 = (kj *)fwd<unsigned_int&>((uint *)params_local_4);
  toCharSequence<unsigned_int&>(&local_80,this_00,value_04);
  value_01 = ::const(local_38);
  local_90 = toCharSequence<char_const(&)[26]>(value_01);
  pSVar1 = fwd<kj::StringPtr&>((StringPtr *)params_4);
  local_a0 = toCharSequence<kj::StringPtr&>(pSVar1);
  value_02 = fwd<kj::String&>((String *)params_5);
  local_b0 = toCharSequence<kj::String&>(value_02);
  value_03 = ::const((char (*) [4])params_6);
  local_c0 = toCharSequence<char_const(&)[4]>(value_03);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (params_7_00,(_ *)&local_48,&local_58,&local_68,(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_14UL> *)&local_90,&local_a0,&local_b0,&local_c0,
             (ArrayPtr<const_char> *)params_7_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}